

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_dart_generator.cc
# Opt level: O2

string * __thiscall
t_dart_generator::get_ttype_class_name_abi_cxx11_
          (string *__return_storage_ptr__,t_dart_generator *this,t_type *ttype)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  string named_import;
  string sStack_58;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  if ((this->super_t_oop_generator).super_t_generator.program_ == ttype->program_) {
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,(string *)CONCAT44(extraout_var_00,iVar1));
  }
  else {
    find_library_name_abi_cxx11_(&sStack_58,this,ttype->program_);
    std::operator+(&local_38,"t_",&sStack_58);
    std::__cxx11::string::~string((string *)&sStack_58);
    std::operator+(&sStack_58,&local_38,".");
    iVar1 = (*(ttype->super_t_doc)._vptr_t_doc[3])(ttype);
    std::operator+(__return_storage_ptr__,&sStack_58,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar1));
    std::__cxx11::string::~string((string *)&sStack_58);
    std::__cxx11::string::~string((string *)&local_38);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string t_dart_generator::get_ttype_class_name(t_type* ttype) {
  if (program_ == ttype->get_program()) {
    return ttype->get_name();
  } else {
    string named_import = "t_" + find_library_name(ttype->get_program());
    return named_import + "." + ttype->get_name();
  }
}